

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

iterator __thiscall
QList<QFontDatabase::WritingSystem>::erase
          (QList<QFontDatabase::WritingSystem> *this,const_iterator abegin,const_iterator aend)

{
  Data *pDVar1;
  iterator iVar2;
  WritingSystem *pWVar3;
  long lVar4;
  
  pWVar3 = (this->d).ptr;
  lVar4 = (long)abegin.i - (long)pWVar3;
  if ((long)aend.i - (long)abegin.i != 0) {
    pDVar1 = (this->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QArrayDataPointer<QFontDatabase::WritingSystem>::reallocateAndGrow
                (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QFontDatabase::WritingSystem> *)0x0);
      pWVar3 = (this->d).ptr;
    }
    QtPrivate::QPodArrayOps<QFontDatabase::WritingSystem>::erase
              ((QPodArrayOps<QFontDatabase::WritingSystem> *)this,
               (WritingSystem *)((long)pWVar3 + lVar4),(long)aend.i - (long)abegin.i >> 2);
  }
  iVar2 = begin(this);
  return (iterator)(iVar2.i + lVar4);
}

Assistant:

typename QList<T>::iterator QList<T>::erase(const_iterator abegin, const_iterator aend)
{
    Q_ASSERT_X(isValidIterator(abegin), "QList::erase", "The specified iterator argument 'abegin' is invalid");
    Q_ASSERT_X(isValidIterator(aend), "QList::erase", "The specified iterator argument 'aend' is invalid");
    Q_ASSERT(aend >= abegin);

    qsizetype i = std::distance(constBegin(), abegin);
    qsizetype n = std::distance(abegin, aend);
    remove(i, n);

    return begin() + i;
}